

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TestCase *
vkt::sr::anon_unknown_0::makeTextureGatherCase
          (TextureType_conflict textureType,TestContext *testCtx,string *name,string *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags,ImageBackingMode sparseCase)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  TestCase *this;
  
  if (textureType == TEXTURETYPE_CUBE) {
    this = (TestCase *)operator_new(0xc0);
    iVar1 = textureSize->m_data[0];
    tcu::TestCase::TestCase
              ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
    (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d270f8;
    this[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    this[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)textureFormat;
    *(CompareMode *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         shadowCompareMode;
    *(WrapMode *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = wrapS;
    *(WrapMode *)&this[1].super_TestCase.super_TestNode.m_name._M_string_length = wrapT;
    uVar3 = *(undefined8 *)((texSwizzle->m_swizzle).m_data + 2);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         *(undefined8 *)(texSwizzle->m_swizzle).m_data;
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = uVar3;
    this[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0xc] = texSwizzle->m_isSome;
    *(FilterMode *)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = minFilter
    ;
    *(FilterMode *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
         = magFilter;
    *(int *)&this[1].super_TestCase.super_TestNode.m_description._M_string_length = baseLevel;
    *(deUint32 *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_string_length + 4) =
         flags;
    *(undefined4 *)&this[1].super_TestCase.super_TestNode.m_description.field_2 = 2;
    *(ImageBackingMode *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 4) =
         sparseCase;
    *(int *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = iVar1;
  }
  else if (textureType == TEXTURETYPE_2D_ARRAY) {
    this = (TestCase *)operator_new(200);
    tcu::TestCase::TestCase
              ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
    (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d27010;
    *(GatherType *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = gatherType;
    *(OffsetSize *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = offsetSize;
    this[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)textureFormat;
    *(CompareMode *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         shadowCompareMode;
    *(WrapMode *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = wrapS;
    *(WrapMode *)&this[1].super_TestCase.super_TestNode.m_name._M_string_length = wrapT;
    uVar3 = *(undefined8 *)((texSwizzle->m_swizzle).m_data + 2);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         *(undefined8 *)(texSwizzle->m_swizzle).m_data;
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = uVar3;
    this[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0xc] = texSwizzle->m_isSome;
    *(FilterMode *)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = minFilter
    ;
    *(FilterMode *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
         = magFilter;
    *(int *)&this[1].super_TestCase.super_TestNode.m_description._M_string_length = baseLevel;
    *(deUint32 *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_string_length + 4) =
         flags;
    *(undefined4 *)&this[1].super_TestCase.super_TestNode.m_description.field_2 = 1;
    *(ImageBackingMode *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 4) =
         sparseCase;
    this[1].super_TestCase.super_TestNode.m_nodeType = textureSize->m_data[2];
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
         *(undefined8 *)textureSize->m_data;
  }
  else if (textureType == TEXTURETYPE_2D) {
    this = (TestCase *)operator_new(0xc0);
    iVar1 = textureSize->m_data[0];
    iVar2 = textureSize->m_data[1];
    tcu::TestCase::TestCase
              ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
    (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d26d90;
    *(GatherType *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = gatherType;
    *(OffsetSize *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = offsetSize;
    this[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)textureFormat;
    *(CompareMode *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         shadowCompareMode;
    *(WrapMode *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = wrapS;
    *(WrapMode *)&this[1].super_TestCase.super_TestNode.m_name._M_string_length = wrapT;
    uVar3 = *(undefined8 *)((texSwizzle->m_swizzle).m_data + 2);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         *(undefined8 *)(texSwizzle->m_swizzle).m_data;
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = uVar3;
    this[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0xc] = texSwizzle->m_isSome;
    *(FilterMode *)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = minFilter
    ;
    *(FilterMode *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
         = magFilter;
    *(int *)&this[1].super_TestCase.super_TestNode.m_description._M_string_length = baseLevel;
    *(deUint32 *)((long)&this[1].super_TestCase.super_TestNode.m_description._M_string_length + 4) =
         flags;
    *(undefined4 *)&this[1].super_TestCase.super_TestNode.m_description.field_2 = 0;
    *(ImageBackingMode *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 4) =
         sparseCase;
    *(int *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = iVar1;
    *(int *)((long)&this[1].super_TestCase.super_TestNode.m_description.field_2 + 0xc) = iVar2;
  }
  else {
    this = (TestCase *)0x0;
  }
  return this;
}

Assistant:

static inline TestCase* makeTextureGatherCase (TextureType					textureType,
											   tcu::TestContext&			testCtx,
											   const string&				name,
											   const string&				description,
											   GatherType					gatherType,
											   OffsetSize					offsetSize,
											   tcu::TextureFormat			textureFormat,
											   tcu::Sampler::CompareMode	shadowCompareMode,
											   tcu::Sampler::WrapMode		wrapS,
											   tcu::Sampler::WrapMode		wrapT,
											   const MaybeTextureSwizzle&	texSwizzle,
											   tcu::Sampler::FilterMode		minFilter,
											   tcu::Sampler::FilterMode		magFilter,
											   int							baseLevel,
											   const IVec3&					textureSize,
											   deUint32						flags = 0,
											   const ImageBackingMode		sparseCase = ShaderRenderCaseInstance::IMAGE_BACKING_MODE_REGULAR)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(testCtx, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1), sparseCase);

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(testCtx, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize, sparseCase);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(testCtx, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x(), sparseCase);

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}